

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::readBasis(Highs *this,string *filename)

{
  bool bVar1;
  string *in_RSI;
  HighsBasis *in_RDI;
  string *in_stack_000000e0;
  HighsBasis read_basis;
  HighsStatus return_status;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  undefined4 in_stack_fffffffffffffea0;
  HighsStatus HVar2;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 uVar3;
  HighsLp *lp;
  HighsBasis *in_stack_fffffffffffffeb8;
  undefined1 local_131 [17];
  string *in_stack_fffffffffffffee0;
  HighsStatus in_stack_fffffffffffffee8;
  HighsStatus in_stack_fffffffffffffeec;
  HighsLogOptions *in_stack_fffffffffffffef0;
  HighsStatus local_4;
  
  logHeader((Highs *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  HighsBasis::HighsBasis(in_RDI,in_stack_fffffffffffffeb8);
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (HighsLogOptions *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  std::__cxx11::string::string((string *)&stack0xfffffffffffffef0,in_RSI);
  readBasisFile((HighsLogOptions *)read_basis._8_8_,(HighsBasis *)read_basis._0_8_,in_stack_000000e0
               );
  uVar3 = 0;
  lp = (HighsLp *)local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_131 + 1),"readBasis",(allocator *)lp);
  local_4 = interpretCallStatus(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                                in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  HVar2 = local_4;
  std::__cxx11::string::~string((string *)(local_131 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_131);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4875ae);
  if (local_4 == kOk) {
    bVar1 = isBasisConsistent(lp,(HighsBasis *)CONCAT44(uVar3,HVar2));
    if (bVar1) {
      HighsBasis::operator=
                ((HighsBasis *)CONCAT44(uVar3,HVar2),
                 (HighsBasis *)CONCAT17(bVar1,in_stack_fffffffffffffe98));
      in_RDI[1].debug_origin_name._M_dataplus = (_Alloc_hider)0x1;
      in_RDI[1].debug_origin_name.field_0x2 = 1;
      newHighsBasis((Highs *)0x4876f0);
      local_4 = kOk;
    }
    else {
      highsLogUser((HighsLogOptions *)&in_RDI[0x25].row_status,kError,"readBasis: invalid basis\n");
      local_4 = kError;
    }
  }
  HighsBasis::~HighsBasis((HighsBasis *)CONCAT44(uVar3,HVar2));
  return local_4;
}

Assistant:

HighsStatus Highs::readBasis(const std::string& filename) {
  this->logHeader();
  HighsStatus return_status = HighsStatus::kOk;
  // Try to read basis file into read_basis
  HighsBasis read_basis = basis_;
  return_status = interpretCallStatus(
      options_.log_options,
      readBasisFile(options_.log_options, read_basis, filename), return_status,
      "readBasis");
  if (return_status != HighsStatus::kOk) return return_status;
  // Basis read OK: check whether it's consistent with the LP
  if (!isBasisConsistent(model_.lp_, read_basis)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "readBasis: invalid basis\n");
    return HighsStatus::kError;
  }
  // Update the HiGHS basis and invalidate any simplex basis for the model
  basis_ = read_basis;
  basis_.valid = true;
  basis_.useful = true;
  // Follow implications of a new HiGHS basis
  newHighsBasis();
  // Can't use returnFromHighs since...
  return HighsStatus::kOk;
}